

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O1

void sdefl_fnd(sdefl_match *m,sdefl *s,int chain_len,int max_match,uchar *in,int p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = 0x7fff;
  if (0x7fff < p) {
    iVar2 = p;
  }
  uVar3 = s->tbl[(uint)(*(int *)(in + p) * -0x61c88677) >> 0x11];
  if ((int)uVar3 <= iVar2 + -0x8000) {
    return;
  }
  do {
    iVar1 = m->len;
    if ((in[(int)(iVar1 + uVar3)] == in[iVar1 + p]) &&
       (*(int *)(in + (int)uVar3) == *(int *)(in + p))) {
      uVar5 = 4;
      if (4 < max_match) {
        uVar5 = 4;
        do {
          if (in[uVar5 + (long)(int)uVar3] != in[uVar5 + (long)p]) goto LAB_00127810;
          uVar5 = uVar5 + 1;
        } while ((uint)max_match != uVar5);
        uVar5 = (ulong)(uint)max_match;
      }
LAB_00127810:
      iVar4 = (int)uVar5;
      if (iVar1 < iVar4) {
        m->len = iVar4;
        m->off = p - uVar3;
        if (iVar4 == max_match) {
          return;
        }
      }
    }
    chain_len = chain_len + -1;
    if (chain_len == 0) {
      return;
    }
    uVar3 = s->prv[uVar3 & 0x7fff];
    if ((int)uVar3 <= iVar2 + -0x8000) {
      return;
    }
  } while( true );
}

Assistant:

static void
sdefl_fnd(struct sdefl_match *m, const struct sdefl *s,
          int chain_len, int max_match, const unsigned char *in, int p) {
  int i = s->tbl[sdefl_hash32(&in[p])];
  int limit = ((p-SDEFL_WIN_SIZ)<SDEFL_NIL)?SDEFL_NIL:(p-SDEFL_WIN_SIZ);
  while (i > limit) {
    if (in[i+m->len] == in[p+m->len] &&
        (sdefl_uload32(&in[i]) == sdefl_uload32(&in[p]))){
      int n = SDEFL_MIN_MATCH;
      while (n < max_match && in[i+n] == in[p+n]) n++;
      if (n > m->len) {
        m->len = n, m->off = p - i;
        if (n == max_match) break;
      }
    }
    if (!(--chain_len)) break;
    i = s->prv[i&SDEFL_WIN_MSK];
  }
}